

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O3

bool __thiscall CCoinsViewDB::HaveCoin(CCoinsViewDB *this,COutPoint *outpoint)

{
  CDBWrapper *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  Span<const_std::byte> key;
  DataStream local_58;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> local_30;
  COutPoint *local_28;
  uchar local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->m_db)._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>.
            _M_t.super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
            super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl;
  local_20[0] = 'C';
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_read_pos = 0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28 = outpoint;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve(&local_58.vch,0x40);
  local_30.m_object = &outpoint->n;
  SerializeMany<DataStream,unsigned_char,transaction_identifier<false>,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
            (&local_58,local_20,&outpoint->hash,&local_30);
  key.m_data = local_58.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start + local_58.m_read_pos;
  key.m_size = (long)local_58.vch.
                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)key.m_data;
  bVar1 = CDBWrapper::ExistsImpl(this_00,key);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewDB::HaveCoin(const COutPoint &outpoint) const {
    return m_db->Exists(CoinEntry(&outpoint));
}